

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

size_t __thiscall
CoreML::Specification::ReverseSeqLayerParams::ByteSizeLong(ReverseSeqLayerParams *this)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  
  if (this->batchaxis_ == 0) {
    sVar3 = 0;
  }
  else {
    uVar2 = this->batchaxis_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = (ulong)((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->sequenceaxis_ != 0) {
    uVar2 = this->sequenceaxis_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = sVar3 + ((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

inline ::google::protobuf::int64 ReverseSeqLayerParams::batchaxis() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.ReverseSeqLayerParams.batchAxis)
  return batchaxis_;
}